

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Integrator.cpp
# Opt level: O2

bool __thiscall
iDynTree::optimalcontrol::integrators::Integrator::getSolution
          (Integrator *this,double time,VectorDynSize *solution)

{
  pointer pSVar1;
  pointer pSVar2;
  int iVar3;
  ostream *poVar4;
  char *pcVar5;
  pointer pcVar6;
  ostringstream errorMsg;
  pointer local_1a8 [4];
  pointer local_188 [47];
  
  pSVar1 = (this->m_solution).
           super__Vector_base<iDynTree::optimalcontrol::integrators::SolutionElement,_std::allocator<iDynTree::optimalcontrol::integrators::SolutionElement>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pSVar2 = (this->m_solution).
           super__Vector_base<iDynTree::optimalcontrol::integrators::SolutionElement,_std::allocator<iDynTree::optimalcontrol::integrators::SolutionElement>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (pSVar2 == pSVar1) {
    pcVar6 = (((this->m_info).m_data.
               super___shared_ptr<iDynTree::optimalcontrol::integrators::IntegratorInfoData,_(__gnu_cxx::_Lock_policy)2>
              ._M_ptr)->name)._M_dataplus._M_p;
    pcVar5 = "No solution computed yet.";
  }
  else {
    if ((time < pSVar1->time) || (pSVar2[-1].time <= time && time != pSVar2[-1].time)) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_188);
      std::operator<<((ostream *)local_188,"Time outside the computed range. ");
      std::operator<<((ostream *)local_188,"Valid range: [");
      poVar4 = std::ostream::_M_insert<double>
                         (((this->m_solution).
                           super__Vector_base<iDynTree::optimalcontrol::integrators::SolutionElement,_std::allocator<iDynTree::optimalcontrol::integrators::SolutionElement>_>
                           ._M_impl.super__Vector_impl_data._M_start)->time);
      std::operator<<(poVar4,", ");
      poVar4 = std::ostream::_M_insert<double>
                         ((this->m_solution).
                          super__Vector_base<iDynTree::optimalcontrol::integrators::SolutionElement,_std::allocator<iDynTree::optimalcontrol::integrators::SolutionElement>_>
                          ._M_impl.super__Vector_impl_data._M_finish[-1].time);
      std::operator<<(poVar4,"]. ");
      std::operator<<((ostream *)local_188,"Requested value: ");
      poVar4 = std::ostream::_M_insert<double>(time);
      std::operator<<(poVar4,".");
      pcVar5 = (((this->m_info).m_data.
                 super___shared_ptr<iDynTree::optimalcontrol::integrators::IntegratorInfoData,_(__gnu_cxx::_Lock_policy)2>
                ._M_ptr)->name)._M_dataplus._M_p;
      std::__cxx11::stringbuf::str();
      iDynTree::reportError(pcVar5,"getSolution",(char *)local_1a8[0]);
      std::__cxx11::string::~string((string *)local_1a8);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_188);
      return (bool)0;
    }
    while (local_188[0] = pSVar1, local_1a8[0] = local_188[0] + 1, local_1a8[0] != pSVar2) {
      pSVar1 = local_1a8[0];
      if ((local_188[0]->time <= time) && (time <= local_188[0][1].time)) {
        iVar3 = (*this->_vptr_Integrator[0xe])(this,local_188,local_1a8,solution);
        return (bool)(char)iVar3;
      }
    }
    pcVar6 = (((this->m_info).m_data.
               super___shared_ptr<iDynTree::optimalcontrol::integrators::IntegratorInfoData,_(__gnu_cxx::_Lock_policy)2>
              ._M_ptr)->name)._M_dataplus._M_p;
    pcVar5 = "Error while searching the desired time.";
  }
  iDynTree::reportError(pcVar6,"getSolution",pcVar5);
  return false;
}

Assistant:

bool Integrator::getSolution(double time, VectorDynSize &solution) const{
                if (m_solution.size() == 0){
                    reportError(m_info.name().c_str(), "getSolution", "No solution computed yet.");
                    return false;
                }

                if((time < m_solution.front().time)||(time > m_solution.back().time)){
                    std::ostringstream errorMsg;
                    errorMsg << "Time outside the computed range. ";
                    errorMsg << "Valid range: [" << m_solution.front().time << ", " << m_solution.back().time << "]. ";
                    errorMsg << "Requested value: " << time << ".";
                    reportError(m_info.name().c_str(), "getSolution", errorMsg.str().c_str());
                    return false;
                }

                for (std::vector<SolutionElement>::const_iterator iteration = m_solution.cbegin();
                     (iteration +1) != m_solution.cend(); ++iteration){

                    if ((iteration->time <= time) && ((iteration + 1)->time >= time)){
                        return interpolatePoints(iteration, iteration+1, time, solution);
                    }
                }

                reportError(m_info.name().c_str(), "getSolution", "Error while searching the desired time.");
                return false;
            }